

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hu_scores.cpp
# Opt level: O0

void HU_DrawScores(player_t *player)

{
  bool bVar1;
  int iVar2;
  AActor *pAVar3;
  player_t *local_58;
  player_t *sortedplayers [8];
  int j;
  int i;
  player_t *player_local;
  
  iVar2 = FIntCVar::operator_cast_to_int(&deathmatch);
  if (iVar2 == 0) {
    bVar1 = FBoolCVar::operator_cast_to_bool(&sb_cooperative_enable);
    if (!bVar1) {
      return;
    }
    if ((multiplayer & 1U) == 0) {
      return;
    }
  }
  else {
    bVar1 = FBoolCVar::operator_cast_to_bool(&teamplay);
    if (bVar1) {
      bVar1 = FBoolCVar::operator_cast_to_bool(&sb_teamdeathmatch_enable);
    }
    else {
      bVar1 = FBoolCVar::operator_cast_to_bool(&sb_deathmatch_enable);
    }
    if (!bVar1) {
      return;
    }
  }
  pAVar3 = TObjPtr::operator_cast_to_AActor_((TObjPtr *)&player->camera);
  _j = player;
  if ((pAVar3 != (AActor *)0x0) &&
     (pAVar3 = TObjPtr<AActor>::operator->(&player->camera), pAVar3->player != (player_t *)0x0)) {
    pAVar3 = TObjPtr<AActor>::operator->(&player->camera);
    _j = pAVar3->player;
  }
  sortedplayers[6] = _j;
  sortedplayers[7]._4_4_ = 0;
  for (sortedplayers[7]._0_4_ = 0; (int)sortedplayers[7] < 7;
      sortedplayers[7]._0_4_ = (int)sortedplayers[7] + 1) {
    if ((player_t *)(&players + (long)sortedplayers[7]._4_4_ * 0x54) == _j) {
      sortedplayers[7]._4_4_ = sortedplayers[7]._4_4_ + 1;
    }
    sortedplayers[(long)(int)sortedplayers[7] + -1] =
         (player_t *)(&players + (long)sortedplayers[7]._4_4_ * 0x54);
    sortedplayers[7]._4_4_ = sortedplayers[7]._4_4_ + 1;
  }
  bVar1 = FBoolCVar::operator_cast_to_bool(&teamplay);
  if ((bVar1) && (iVar2 = FIntCVar::operator_cast_to_int(&deathmatch), iVar2 != 0)) {
    qsort(&local_58,8,8,compareteams);
  }
  else {
    qsort(&local_58,8,8,comparepoints);
  }
  HU_DoDrawScores(_j,&local_58);
  V_SetBorderNeedRefresh();
  return;
}

Assistant:

void HU_DrawScores (player_t *player)
{
	if (deathmatch)
	{
		if (teamplay)
		{
			if (!sb_teamdeathmatch_enable)
				return;
		}
		else
		{
			if (!sb_deathmatch_enable)
				return;
		}
	}
	else
	{
		if (!sb_cooperative_enable || !multiplayer)
			return;
	}

	int i, j;
	player_t *sortedplayers[MAXPLAYERS];

	if (player->camera && player->camera->player)
		player = player->camera->player;

	sortedplayers[MAXPLAYERS-1] = player;
	for (i = 0, j = 0; j < MAXPLAYERS - 1; i++, j++)
	{
		if (&players[i] == player)
			i++;
		sortedplayers[j] = &players[i];
	}

	if (teamplay && deathmatch)
		qsort (sortedplayers, MAXPLAYERS, sizeof(player_t *), compareteams);
	else
		qsort (sortedplayers, MAXPLAYERS, sizeof(player_t *), comparepoints);

	HU_DoDrawScores (player, sortedplayers);

	V_SetBorderNeedRefresh();
}